

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_func_t * wasm_func_new(wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_t callback)

{
  FuncType *pFVar1;
  wasm_func_t *this;
  __0 *this_00;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  Ptr local_130;
  RefPtr<wabt::interp::Func> local_118;
  FuncType local_100;
  FuncType wabt_type;
  anon_class_80_3_e2e6609b lambda;
  
  pFVar1 = wasm_externtype_t::As<wabt::interp::FuncType>(&type->super_wasm_externtype_t);
  wabt::interp::FuncType::FuncType(&wabt_type,pFVar1);
  lambda.store = store;
  wabt::interp::FuncType::FuncType(&lambda.wabt_type,&wabt_type);
  lambda.callback = callback;
  this = (wasm_func_t *)operator_new(0x18);
  wabt::interp::FuncType::FuncType(&local_100,&wabt_type);
  local_150._8_8_ = 0;
  this_00 = (__0 *)operator_new(0x50);
  wasm_func_new::$_0::__0(this_00,&lambda);
  local_138 = std::
              _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:733:17)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:733:17)>
              ::_M_manager;
  local_150._M_unused._0_8_ = (undefined8)this_00;
  wabt::interp::HostFunc::New(&local_130,&store->I,&local_100,(Callback *)&local_150);
  wabt::interp::RefPtr<wabt::interp::Func>::RefPtr<wabt::interp::HostFunc>(&local_118,&local_130);
  wasm_func_t::wasm_func_t(this,&local_118);
  wabt::interp::RefPtr<wabt::interp::Func>::reset(&local_118);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&local_130);
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_100);
  wabt::interp::FuncType::~FuncType(&lambda.wabt_type);
  wabt::interp::FuncType::~FuncType(&wabt_type);
  return this;
}

Assistant:

own wasm_func_t* wasm_func_new(wasm_store_t* store,
                               const wasm_functype_t* type,
                               wasm_func_callback_t callback) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](const Values& wabt_params, Values& wabt_results,
                    Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, params.data, wabt_type.params, wabt_params);
    auto trap = callback(params.data, results.data);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(results.data, results.size);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}